

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O3

void __thiscall btVectorX<float>::btVectorX(btVectorX<float> *this,int numRows)

{
  float *ptr;
  float *__s;
  long lVar1;
  long lVar2;
  
  (this->m_storage).m_ownsMemory = true;
  (this->m_storage).m_data = (float *)0x0;
  (this->m_storage).m_size = 0;
  (this->m_storage).m_capacity = 0;
  if (numRows < 1) goto LAB_001d1ced;
  __s = (float *)btAlignedAllocInternal((ulong)(uint)numRows << 2,0x10);
  lVar1 = (long)(this->m_storage).m_size;
  ptr = (this->m_storage).m_data;
  if (lVar1 < 1) {
    if (ptr != (float *)0x0) goto LAB_001d1cca;
  }
  else {
    lVar2 = 0;
    do {
      __s[lVar2] = ptr[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar1 != lVar2);
LAB_001d1cca:
    if ((this->m_storage).m_ownsMemory == true) {
      btAlignedFreeInternal(ptr);
    }
  }
  (this->m_storage).m_ownsMemory = true;
  (this->m_storage).m_data = __s;
  (this->m_storage).m_capacity = numRows;
  memset(__s,0,(ulong)(uint)numRows << 2);
LAB_001d1ced:
  (this->m_storage).m_size = numRows;
  return;
}

Assistant:

btVectorX(int numRows)
	{
		m_storage.resize(numRows);
	}